

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O3

void __thiscall
TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test::testBody
          (TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test *this)

{
  pointer pcVar1;
  bool bVar2;
  TestName *__x;
  string *psVar3;
  UtestShell *pUVar4;
  ApprovalTestNamer namer;
  TestName test;
  TestTerminatorWithoutExceptions local_d0;
  string local_c8;
  ApprovalTestNamer local_a8;
  string local_a0;
  undefined1 local_80 [24];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  bVar2 = ApprovalTests::SystemUtils::isWindowsOs();
  if (bVar2) {
    local_a8.super_ApprovalNamer._vptr_ApprovalNamer = (ApprovalNamer)&PTR__ApprovalNamer_00169808;
    __x = ApprovalTests::ApprovalTestNamer::currentTest((TestName *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_80,&__x->sections);
    pcVar1 = (__x->fileName)._M_dataplus._M_p;
    local_68._M_p = (pointer)&local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + (__x->fileName)._M_string_length);
    pcVar1 = (__x->originalFileName)._M_dataplus._M_p;
    local_48._M_p = (pointer)&local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (__x->originalFileName)._M_string_length);
    psVar3 = ApprovalTests::TestName::getFileName_abi_cxx11_((TestName *)local_80);
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar1,pcVar1 + psVar3->_M_string_length);
    ApprovalTests::StringUtils::toLower(&local_c8,&local_a0);
    ApprovalTests::TestName::setFileName((TestName *)local_80,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    ApprovalTests::ApprovalTestNamer::currentTest((TestName *)local_80);
    pUVar4 = UtestShell::getCurrent();
    ApprovalTests::ApprovalTestNamer::getFileName_abi_cxx11_((string *)&local_c8,&local_a8);
    local_d0.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_0016c8c0;
    (*pUVar4->_vptr_UtestShell[9])
              (pUVar4,local_c8._M_dataplus._M_p,"CppUTestNamerTests",0,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/CppUTest_Tests/namers/CppUTestNamerTests.cpp"
               ,0x35,&local_d0);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
  }
  return;
}

Assistant:

TEST(NamerTestGroup, TestProperNameCaseOnWindows)
{
    if (SystemUtils::isWindowsOs())
    {
        ApprovalTestNamer namer;
        auto test = ApprovalTestNamer::currentTest();
        test.setFileName(StringUtils::toLower(test.getFileName()));
        ApprovalTestNamer::currentTest(&test);
        STRCMP_EQUAL(namer.getFileName().c_str(), "CppUTestNamerTests");
    }
}